

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int get_intersection(string *s1,string *s2)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  
  uVar4 = s1->_M_string_length;
  lVar2 = std::__cxx11::string::find((char *)s2,(ulong)(s1->_M_dataplus)._M_p,0);
  if (lVar2 == -1) {
    if (uVar4 == 0) {
      return 0;
    }
    pcVar1 = (s2->_M_dataplus)._M_p;
    uVar6 = 0;
    pcVar5 = pcVar1;
    uVar3 = uVar6;
    do {
      while ((s1->_M_dataplus)._M_p[uVar6] != *pcVar5) {
        uVar6 = uVar3 + 1;
        pcVar5 = pcVar1;
        uVar3 = uVar6;
        if (uVar6 == uVar4) {
          return 0;
        }
      }
      uVar6 = uVar6 + 1;
      pcVar5 = pcVar5 + 1;
    } while (uVar6 < uVar4);
    uVar4 = (ulong)(uint)((int)uVar4 - (int)uVar3);
  }
  return (int)uVar4;
}

Assistant:

int get_intersection(const std::string& s1, const std::string& s2)
{
    size_t l = s1.length();
    if (std::string::npos != s2.find(s1))
    {
        return l;
    }
    for (size_t i = 0; i < l; i++)
    {
        bool result = true;
        for (size_t j = i; j < l; j++)
        {
            if (s1[j] != s2[j - i])
            {
                result = false;
                break;
            }
        }
        if (result)
        {
            return l - i;
        }
    }
    return 0;
}